

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O0

void __thiscall
AlternativeLoader::altSplitLine
          (AlternativeLoader *this,string *line,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *pLineWords,string *mode)

{
  bool bVar1;
  long lVar2;
  string local_e0 [32];
  string local_c0 [48];
  string local_90 [8];
  string delimiter;
  string token;
  size_t pos;
  string mLine;
  string *mode_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pLineWords_local;
  string *line_local;
  AlternativeLoader *this_local;
  
  mLine.field_2._8_8_ = mode;
  std::__cxx11::string::string((string *)&pos,(string *)line);
  std::__cxx11::string::string((string *)(delimiter.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_90);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          mLine.field_2._8_8_,"Map");
  if (!bVar1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            mLine.field_2._8_8_,"Continents");
    if (!bVar1) {
      std::__cxx11::string::operator=(local_90,",");
      while( true ) {
        lVar2 = std::__cxx11::string::find((string *)&pos,(ulong)local_90);
        if (lVar2 == -1) break;
        std::__cxx11::string::substr((ulong)local_e0,(ulong)&pos);
        std::__cxx11::string::operator=((string *)(delimiter.field_2._M_local_buf + 8),local_e0);
        std::__cxx11::string::~string(local_e0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(pLineWords,(value_type *)(delimiter.field_2._M_local_buf + 8));
        std::__cxx11::string::length();
        std::__cxx11::string::erase((ulong)&pos,0);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pLineWords,(value_type *)&pos);
      goto LAB_0013334a;
    }
  }
  std::__cxx11::string::operator=(local_90,"=");
  while( true ) {
    lVar2 = std::__cxx11::string::find((string *)&pos,(ulong)local_90);
    if (lVar2 == -1) break;
    std::__cxx11::string::substr((ulong)local_c0,(ulong)&pos);
    std::__cxx11::string::operator=((string *)(delimiter.field_2._M_local_buf + 8),local_c0);
    std::__cxx11::string::~string(local_c0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pLineWords,(value_type *)(delimiter.field_2._M_local_buf + 8));
    std::__cxx11::string::length();
    std::__cxx11::string::erase((ulong)&pos,0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pLineWords,(value_type *)&pos);
LAB_0013334a:
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string((string *)(delimiter.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&pos);
  return;
}

Assistant:

void AlternativeLoader::altSplitLine(const std::string &line, std::vector<std::string> *pLineWords, const std::string& mode) {
    std::string mLine = line;
    size_t pos;
    std::string token;
    std::string delimiter;
    if(mode == "Map" || mode == "Continents"){
        //split each line into vector of words (split by =)
        delimiter = "=";
        while((pos = mLine.find(delimiter)) != std::string::npos){
            token = mLine.substr(0,pos);
            pLineWords->push_back(token);
            mLine.erase(0,pos + delimiter.length());
        }
        pLineWords->push_back(mLine);
    }else{
        //split each line into vector of words (split by ,)
        delimiter = ",";
        while((pos = mLine.find(delimiter)) != std::string::npos){
            token = mLine.substr(0,pos);
            pLineWords->push_back(token);
            mLine.erase(0,pos + delimiter.length());
        }
        pLineWords->push_back(mLine);
    }
}